

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O0

LY_ERR parse_config(lysp_yang_ctx *ctx,uint16_t *flags,lysp_ext_instance **exts)

{
  LY_ERR LVar1;
  int iVar2;
  char *pcVar3;
  ly_ctx *local_80;
  ly_ctx *local_70;
  ly_ctx *local_68;
  ly_ctx *local_60;
  bool local_51;
  LY_ERR ret___1;
  ly_stmt lStack_4c;
  ly_bool __loop_end;
  LY_ERR ret__;
  ly_stmt kw;
  size_t word_len;
  char *word;
  char *buf;
  lysp_ext_instance **pplStack_28;
  LY_ERR ret;
  lysp_ext_instance **exts_local;
  uint16_t *flags_local;
  lysp_yang_ctx *ctx_local;
  
  buf._4_4_ = 0;
  pplStack_28 = exts;
  exts_local = (lysp_ext_instance **)flags;
  flags_local = (uint16_t *)ctx;
  if ((*flags & 3) != 0) {
    if (ctx == (lysp_yang_ctx *)0x0) {
      local_60 = (ly_ctx *)0x0;
    }
    else {
      local_60 = (ly_ctx *)
                 **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
    }
    ly_vlog(local_60,(char *)0x0,LYVE_SYNTAX_YANG,"Duplicate keyword \"%s\".","config");
    return LY_EVALID;
  }
  LVar1 = get_argument(ctx,Y_STR_ARG,(uint16_t *)0x0,(char **)&word_len,&word,(size_t *)&ret__);
  if (LVar1 != LY_SUCCESS) {
    return LVar1;
  }
  if ((_ret__ == 4) && (iVar2 = strncmp((char *)word_len,"true",4), iVar2 == 0)) {
    *(ushort *)exts_local = *(ushort *)exts_local | 1;
  }
  else {
    if ((_ret__ != 5) || (iVar2 = strncmp((char *)word_len,"false",5), iVar2 != 0)) {
      if (flags_local == (uint16_t *)0x0) {
        local_68 = (ly_ctx *)0x0;
      }
      else {
        local_68 = *(ly_ctx **)
                    **(undefined8 **)
                      (*(long *)(*(long *)(flags_local + 0x1c) + 8) +
                      (ulong)(*(int *)(*(long *)(flags_local + 0x1c) + 4) - 1) * 8);
      }
      ly_vlog(local_68,(char *)0x0,LYVE_SYNTAX_YANG,"Invalid value \"%.*s\" of \"%s\".",
              _ret__ & 0xffffffff,word_len,"config");
      free(word);
      return LY_EVALID;
    }
    *(ushort *)exts_local = *(ushort *)exts_local | 2;
  }
  free(word);
  buf._4_4_ = get_keyword((lysp_yang_ctx *)flags_local,&stack0xffffffffffffffb4,(char **)&word_len,
                          (size_t *)&ret__);
  if (buf._4_4_ != LY_SUCCESS) {
    return buf._4_4_;
  }
  if (lStack_4c == LY_STMT_SYNTAX_SEMICOLON) {
    local_51 = true;
  }
  else {
    if (lStack_4c != LY_STMT_SYNTAX_LEFT_BRACE) {
      if (flags_local == (uint16_t *)0x0) {
        local_70 = (ly_ctx *)0x0;
      }
      else {
        local_70 = *(ly_ctx **)
                    **(undefined8 **)
                      (*(long *)(*(long *)(flags_local + 0x1c) + 8) +
                      (ulong)(*(int *)(*(long *)(flags_local + 0x1c) + 4) - 1) * 8);
      }
      pcVar3 = lyplg_ext_stmt2str(lStack_4c);
      ly_vlog(local_70,(char *)0x0,LYVE_SYNTAX_YANG,
              "Invalid keyword \"%s\", expected \";\" or \"{\".",pcVar3);
      return LY_EVALID;
    }
    LVar1 = get_keyword((lysp_yang_ctx *)flags_local,&stack0xffffffffffffffb4,(char **)&word_len,
                        (size_t *)&ret__);
    if (LVar1 != LY_SUCCESS) {
      return LVar1;
    }
    local_51 = lStack_4c == LY_STMT_SYNTAX_RIGHT_BRACE;
  }
  while( true ) {
    buf._4_4_ = 0;
    if (local_51) {
      return LY_SUCCESS;
    }
    if (lStack_4c != LY_STMT_EXTENSION_INSTANCE) {
      if (flags_local == (uint16_t *)0x0) {
        local_80 = (ly_ctx *)0x0;
      }
      else {
        local_80 = *(ly_ctx **)
                    **(undefined8 **)
                      (*(long *)(*(long *)(flags_local + 0x1c) + 8) +
                      (ulong)(*(int *)(*(long *)(flags_local + 0x1c) + 4) - 1) * 8);
      }
      pcVar3 = lyplg_ext_stmt2str(lStack_4c);
      ly_vlog(local_80,(char *)0x0,LYVE_SYNTAX_YANG,"Invalid keyword \"%s\" as a child of \"%s\".",
              pcVar3,"config");
      return LY_EVALID;
    }
    LVar1 = parse_ext((lysp_yang_ctx *)flags_local,(char *)word_len,_ret__,exts_local,LY_STMT_CONFIG
                      ,0,pplStack_28);
    if (LVar1 != LY_SUCCESS) {
      return LVar1;
    }
    LVar1 = get_keyword((lysp_yang_ctx *)flags_local,&stack0xffffffffffffffb4,(char **)&word_len,
                        (size_t *)&ret__);
    if (LVar1 != LY_SUCCESS) break;
    if (lStack_4c == LY_STMT_SYNTAX_RIGHT_BRACE) {
      local_51 = true;
    }
  }
  return LVar1;
}

Assistant:

static LY_ERR
parse_config(struct lysp_yang_ctx *ctx, uint16_t *flags, struct lysp_ext_instance **exts)
{
    LY_ERR ret = LY_SUCCESS;
    char *buf, *word;
    size_t word_len;
    enum ly_stmt kw;

    if (*flags & LYS_CONFIG_MASK) {
        LOGVAL_PARSER(ctx, LY_VCODE_DUPSTMT, "config");
        return LY_EVALID;
    }

    /* get value */
    LY_CHECK_RET(get_argument(ctx, Y_STR_ARG, NULL, &word, &buf, &word_len));

    if ((word_len == ly_strlen_const("true")) && !strncmp(word, "true", word_len)) {
        *flags |= LYS_CONFIG_W;
    } else if ((word_len == ly_strlen_const("false")) && !strncmp(word, "false", word_len)) {
        *flags |= LYS_CONFIG_R;
    } else {
        LOGVAL_PARSER(ctx, LY_VCODE_INVAL, (int)word_len, word, "config");
        free(buf);
        return LY_EVALID;
    }
    free(buf);

    YANG_READ_SUBSTMT_FOR_GOTO(ctx, kw, word, word_len, ret, cleanup) {
        switch (kw) {
        case LY_STMT_EXTENSION_INSTANCE:
            LY_CHECK_RET(parse_ext(ctx, word, word_len, flags, LY_STMT_CONFIG, 0, exts));
            break;
        default:
            LOGVAL_PARSER(ctx, LY_VCODE_INCHILDSTMT, lyplg_ext_stmt2str(kw), "config");
            return LY_EVALID;
        }
        YANG_READ_SUBSTMT_NEXT_ITER(ctx, kw, word, word_len, NULL, ret, cleanup);
    }

cleanup:
    return ret;
}